

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O1

size_t __thiscall
c4::basic_substring<char>::last_of(basic_substring<char> *this,char c,size_t start)

{
  long lVar1;
  size_t sVar2;
  
  if ((start != 0xffffffffffffffff) && (this->len < start)) {
    last_of();
  }
  if (start == 0xffffffffffffffff) {
    start = this->len;
  }
  do {
    sVar2 = start - 1;
    if (start == 0) {
      return 0xffffffffffffffff;
    }
    lVar1 = start - 1;
    start = sVar2;
  } while (this->str[lVar1] != c);
  return sVar2;
}

Assistant:

size_t last_of(const C c, size_t start=npos) const
    {
        C4_ASSERT(start == npos || (start >= 0 && start <= len));
        if(start == npos)
            start = len;
        for(size_t i = start-1; i != size_t(-1); --i)
        {
            if(str[i] == c)
                return i;
        }
        return npos;
    }